

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFile.cpp
# Opt level: O2

void __thiscall BRDFile::BRDFile(BRDFile *this,vector<char,_std::allocator<char>_> *buf)

{
  BRDPinSide BVar1;
  pointer __src;
  pointer pBVar2;
  mapped_type pcVar3;
  pointer pBVar4;
  bool bVar5;
  size_t __size;
  string *psVar6;
  BRDFile *pBVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t i;
  int *__dest;
  char *arena_end;
  long lVar11;
  mapped_type *ppcVar12;
  ulong uVar13;
  int iVar14;
  byte *pbVar15;
  byte bVar16;
  size_t __n;
  BRDNail *nail_1;
  ulong uVar17;
  pointer ppcVar18;
  pointer pBVar19;
  pointer pBVar20;
  int *buffer;
  byte *pbVar21;
  allocator<char> local_211;
  string *local_210;
  BRDFile *local_208;
  char *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  BRDNail nail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  nailsToNets;
  char *arena;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_70;
  vector<BRDPin,_std::allocator<BRDPin>_> *local_68;
  vector<BRDNail,_std::allocator<BRDNail>_> *local_60;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_58;
  pointer local_50;
  vector<char_*,_std::allocator<char_*>_> lines;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_00203340;
  uVar17 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
               ,(allocator<char> *)&nail);
    std::operator+(&local_1f8,&local_e8,":");
    std::__cxx11::to_string(&local_1d8,0x1c);
    std::operator+(&local_1b8,&local_1f8,&local_1d8);
    std::operator+(&local_178,&local_1b8,": ");
    std::operator+(&local_198,&local_178,"BRDFile::BRDFile(std::vector<char> &)");
    std::operator+(&local_158,&local_198,": Assertion `");
    std::operator+(&local_138,&local_158,"buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nailsToNets
                   ,&local_138,"\' failed.");
    std::__cxx11::string::operator=
              ((string *)&(this->super_BRDFileBase).error_msg,(string *)&nailsToNets);
    std::__cxx11::string::~string((string *)&nailsToNets);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_e8);
    SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
  }
  else {
    __size = (uVar17 + 1) * 3;
    __dest = (int *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = (char *)__dest;
    local_208 = this;
    if (__dest == (int *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                 ,(allocator<char> *)&nail);
      pBVar7 = local_208;
      std::operator+(&local_1f8,&local_e8,":");
      std::__cxx11::to_string(&local_1d8,0x1f);
      std::operator+(&local_1b8,&local_1f8,&local_1d8);
      std::operator+(&local_178,&local_1b8,": ");
      std::operator+(&local_198,&local_178,"BRDFile::BRDFile(std::vector<char> &)");
      std::operator+(&local_158,&local_198,": Assertion `");
      std::operator+(&local_138,&local_158,"file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nailsToNets,&local_138,"\' failed.");
      std::__cxx11::string::operator=
                ((string *)&(pBVar7->super_BRDFileBase).error_msg,(string *)&nailsToNets);
      std::__cxx11::string::~string((string *)&nailsToNets);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_e8);
      SDL_LogError(1,"%s",(pBVar7->super_BRDFileBase).error_msg._M_dataplus._M_p);
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
      pBVar7 = local_208;
      *(undefined1 *)((long)__dest + uVar17) = 0;
      arena = (char *)(uVar17 + 1 + (long)__dest);
      *(undefined1 *)((long)__dest + (__size - 1)) = 0;
      buffer = __dest;
      if (*__dest == 0x2863e223) {
        for (uVar13 = 0; buffer = (int *)(local_208->super_BRDFileBase).file_buf, uVar17 != uVar13;
            uVar13 = uVar13 + 1) {
          bVar16 = *(byte *)((long)buffer + uVar13);
          if ((0xd < bVar16) || ((0x2401U >> (bVar16 & 0x1f) & 1) == 0)) {
            bVar16 = ~(((byte)((uint)(int)(char)bVar16 >> 6) & 3) + bVar16 * '\x04');
          }
          *(byte *)((long)buffer + uVar13) = bVar16;
        }
      }
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile((char *)buffer,&lines);
      arena_end = (char *)((long)__dest + (__size - 1));
      local_50 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_60 = &(pBVar7->super_BRDFileBase).nails;
      local_210 = (string *)&(pBVar7->super_BRDFileBase).error_msg;
      local_68 = &(pBVar7->super_BRDFileBase).pins;
      local_70 = &(pBVar7->super_BRDFileBase).parts;
      local_58 = &(pBVar7->super_BRDFileBase).format;
      iVar14 = 0;
      for (ppcVar18 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppcVar18 != local_50;
          ppcVar18 = ppcVar18 + 1) {
        pbVar15 = (byte *)*ppcVar18;
        pbVar21 = pbVar15 + -1;
        do {
          pbVar15 = pbVar15 + 1;
          bVar16 = pbVar21[1];
          pbVar21 = pbVar21 + 1;
          iVar8 = isspace((uint)bVar16);
        } while (iVar8 != 0);
        iVar8 = iVar14;
        if (bVar16 != 0) {
          iVar9 = strcmp((char *)pbVar21,"str_length:");
          iVar8 = 1;
          if (iVar9 != 0) {
            iVar9 = strcmp((char *)pbVar21,"var_data:");
            iVar8 = 2;
            if (iVar9 != 0) {
              iVar9 = strcmp((char *)pbVar21,"Format:");
              iVar8 = 3;
              if (iVar9 != 0) {
                iVar9 = strcmp((char *)pbVar21,"format:");
                iVar8 = 3;
                if (iVar9 != 0) {
                  iVar9 = strcmp((char *)pbVar21,"Parts:");
                  iVar8 = 4;
                  if (iVar9 != 0) {
                    iVar9 = strcmp((char *)pbVar21,"Pins1:");
                    iVar8 = 4;
                    if (iVar9 != 0) {
                      iVar9 = strcmp((char *)pbVar21,"Pins:");
                      iVar8 = 5;
                      if (iVar9 != 0) {
                        iVar9 = strcmp((char *)pbVar21,"Pins2:");
                        iVar8 = 5;
                        if (iVar9 != 0) {
                          iVar9 = strcmp((char *)pbVar21,"Nails:");
                          iVar8 = 6;
                          if (iVar9 != 0) {
                            p = (char *)pbVar21;
                            iVar8 = iVar14;
                            switch(iVar14) {
                            case 2:
                              lVar11 = strtol((char *)pbVar21,&p,10);
                              if ((int)(uint)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x5b);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              (local_208->super_BRDFileBase).num_format = (uint)lVar11;
                              lVar11 = strtol(p,&p,10);
                              if ((int)(uint)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x5c);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              (local_208->super_BRDFileBase).num_parts = (uint)lVar11;
                              lVar11 = strtol(p,&p,10);
                              if ((int)(uint)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x5d);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              (local_208->super_BRDFileBase).num_pins = (uint)lVar11;
                              lVar11 = strtol(p,&p,10);
                              if ((int)(uint)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x5e);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              (local_208->super_BRDFileBase).num_nails = (uint)lVar11;
                              break;
                            case 3:
                              if ((ulong)(local_208->super_BRDFileBase).num_format <=
                                  (ulong)((long)(local_208->super_BRDFileBase).format.
                                                super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_208->super_BRDFileBase).format.
                                                super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x61);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"format.size() < num_format");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nailsToNets._M_h._M_buckets = (__buckets_ptr)0x0;
                              lVar11 = strtol((char *)pbVar21,&p,10);
                              nailsToNets._M_h._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT44(nailsToNets._M_h._M_buckets._4_4_,(int)lVar11);
                              lVar11 = strtol(p,&p,10);
                              nailsToNets._M_h._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT44((int)lVar11,nailsToNets._M_h._M_buckets._0_4_);
                              std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                                        (local_58,(value_type *)&nailsToNets);
                              break;
                            case 4:
                              if ((ulong)(local_208->super_BRDFileBase).num_parts <=
                                  (ulong)(((long)(local_208->super_BRDFileBase).parts.
                                                 super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_208->super_BRDFileBase).parts.
                                                super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                ._M_impl.super__Vector_impl_data._M_start) / 0x48))
                              {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x68);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"parts.size() < num_parts");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nailsToNets._M_h._M_buckets = (__buckets_ptr)0x0;
                              nailsToNets._M_h._M_bucket_count =
                                   (size_type)&nailsToNets._M_h._M_element_count;
                              nailsToNets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                              nailsToNets._M_h._M_element_count =
                                   nailsToNets._M_h._M_element_count & 0xffffffffffffff00;
                              nailsToNets._M_h._M_rehash_policy._M_next_resize = 0;
                              nailsToNets._M_h._M_single_bucket._0_4_ = 0;
                              nailsToNets._M_h._M_single_bucket._4_4_ = 0;
                              while ((uVar10 = (uint)*pbVar21, *pbVar21 != 0 &&
                                     (iVar8 = isspace(uVar10), iVar8 != 0))) {
                                pbVar21 = pbVar21 + 1;
                                pbVar15 = pbVar15 + 1;
                              }
                              while (((char)uVar10 != '\0' && (iVar8 = isspace(uVar10), iVar8 == 0))
                                    ) {
                                uVar10 = (uint)*pbVar15;
                                pbVar15 = pbVar15 + 1;
                              }
                              pbVar15[-1] = 0;
                              p = (char *)pbVar15;
                              nailsToNets._M_h._M_buckets =
                                   (__buckets_ptr)fix_to_utf8((char *)pbVar21,&arena,arena_end);
                              uVar17 = strtol((char *)pbVar15,&p,10);
                              uVar10 = (uint)uVar17;
                              if ((int)uVar10 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1d8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_e8,&local_1d8,":");
                                std::__cxx11::to_string((string *)&nail,0x6b);
                                std::operator+(&local_1f8,&local_e8,(string *)&nail);
                                std::operator+(&local_1b8,&local_1f8,": ");
                                std::operator+(&local_178,&local_1b8,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_198,&local_178,": Assertion `");
                                std::operator+(&local_158,&local_198,"value >= 0");
                                std::operator+(&local_138,&local_158,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&nail);
                                std::__cxx11::string::~string((string *)&local_e8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              bVar5 = 7 < uVar10 || uVar10 == 2;
                              if (((bVar5) || (uVar10 == 1)) || ((uVar10 & 0xfffffffc) == 4)) {
                                nailsToNets._M_h._M_rehash_policy._M_next_resize._0_4_ =
                                     2 - (uint)bVar5;
                              }
                              nailsToNets._M_h._M_rehash_policy._M_next_resize =
                                   (size_t)CONCAT14((uVar17 & 0xc) == 0,
                                                    (int)nailsToNets._M_h._M_rehash_policy.
                                                         _M_next_resize);
                              lVar11 = strtol(p,&p,10);
                              uVar10 = (uint)lVar11;
                              if ((int)uVar10 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1d8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_e8,&local_1d8,":");
                                std::__cxx11::to_string((string *)&nail,0x6f);
                                std::operator+(&local_1f8,&local_e8,(string *)&nail);
                                std::operator+(&local_1b8,&local_1f8,": ");
                                std::operator+(&local_178,&local_1b8,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_198,&local_178,": Assertion `");
                                std::operator+(&local_158,&local_198,"value >= 0");
                                std::operator+(&local_138,&local_158,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&nail);
                                std::__cxx11::string::~string((string *)&local_e8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nailsToNets._M_h._M_single_bucket._0_4_ = uVar10;
                              if ((local_208->super_BRDFileBase).num_pins < uVar10) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1d8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_e8,&local_1d8,":");
                                std::__cxx11::to_string((string *)&nail,0x70);
                                std::operator+(&local_1f8,&local_e8,(string *)&nail);
                                std::operator+(&local_1b8,&local_1f8,": ");
                                std::operator+(&local_178,&local_1b8,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_198,&local_178,": Assertion `");
                                std::operator+(&local_158,&local_198,"part.end_of_pins <= num_pins")
                                ;
                                std::operator+(&local_138,&local_158,"\' failed.");
                                psVar6 = local_210;
                                std::__cxx11::string::operator=(local_210,(string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&nail);
                                std::__cxx11::string::~string((string *)&local_e8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                SDL_LogError(1,"%s",*(undefined8 *)psVar6);
                              }
                              std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                        (local_70,(value_type *)&nailsToNets);
                              std::__cxx11::string::~string
                                        ((string *)&nailsToNets._M_h._M_bucket_count);
                              iVar8 = iVar14;
                              break;
                            case 5:
                              if ((ulong)(local_208->super_BRDFileBase).num_pins <=
                                  (ulong)(((long)(local_208->super_BRDFileBase).pins.
                                                 super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_208->super_BRDFileBase).pins.
                                                super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                                _M_impl.super__Vector_impl_data._M_start) / 0x38)) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x74);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"pins.size() < num_pins");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nailsToNets._M_h._M_before_begin._M_nxt =
                                   nailsToNets._M_h._M_before_begin._M_nxt & 0xffffffff00000000;
                              nailsToNets._M_h._M_buckets = (__buckets_ptr)0x0;
                              nailsToNets._M_h._M_bucket_count = 0;
                              nailsToNets._M_h._M_element_count = (size_type)anon_var_dwarf_72a25;
                              nailsToNets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
                              nailsToNets._M_h._M_rehash_policy._4_4_ = 0x3fe00000;
                              nailsToNets._M_h._M_rehash_policy._M_next_resize = 0;
                              nailsToNets._M_h._M_single_bucket._0_4_ = 0;
                              nailsToNets._M_h._M_single_bucket._4_4_ = 0;
                              lVar11 = strtol((char *)pbVar21,&p,10);
                              nailsToNets._M_h._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT44(nailsToNets._M_h._M_buckets._4_4_,(int)lVar11);
                              lVar11 = strtol(p,&p,10);
                              nailsToNets._M_h._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT44((int)lVar11,nailsToNets._M_h._M_buckets._0_4_);
                              lVar11 = strtol(p,&p,10);
                              nailsToNets._M_h._M_bucket_count =
                                   CONCAT44(nailsToNets._M_h._M_bucket_count._4_4_,(int)lVar11);
                              lVar11 = strtol(p,&p,10);
                              uVar10 = (uint)lVar11;
                              if ((int)uVar10 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1d8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_e8,&local_1d8,":");
                                std::__cxx11::to_string((string *)&nail,0x79);
                                std::operator+(&local_1f8,&local_e8,(string *)&nail);
                                std::operator+(&local_1b8,&local_1f8,": ");
                                std::operator+(&local_178,&local_1b8,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_198,&local_178,": Assertion `");
                                std::operator+(&local_158,&local_198,"value >= 0");
                                std::operator+(&local_138,&local_158,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&nail);
                                std::__cxx11::string::~string((string *)&local_e8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nailsToNets._M_h._M_bucket_count =
                                   CONCAT44(uVar10,(undefined4)nailsToNets._M_h._M_bucket_count);
                              pbVar21 = (byte *)p;
                              if ((local_208->super_BRDFileBase).num_parts < uVar10) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1d8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_e8,&local_1d8,":");
                                std::__cxx11::to_string((string *)&nail,0x7a);
                                std::operator+(&local_1f8,&local_e8,(string *)&nail);
                                std::operator+(&local_1b8,&local_1f8,": ");
                                std::operator+(&local_178,&local_1b8,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_198,&local_178,": Assertion `");
                                std::operator+(&local_158,&local_198,"pin.part <= num_parts");
                                std::operator+(&local_138,&local_158,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&nail);
                                std::__cxx11::string::~string((string *)&local_e8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                                pbVar21 = (byte *)p;
                              }
                              while ((bVar16 = *pbVar21, pbVar15 = pbVar21, bVar16 != 0 &&
                                     (iVar8 = isspace((uint)bVar16), iVar8 != 0))) {
                                pbVar21 = pbVar21 + 1;
                              }
                              while ((bVar16 != 0 && (iVar8 = isspace((uint)bVar16), iVar8 == 0))) {
                                bVar16 = pbVar15[1];
                                pbVar15 = pbVar15 + 1;
                              }
                              *pbVar15 = 0;
                              p = (char *)pbVar15;
                              nailsToNets._M_h._M_element_count =
                                   (size_type)fix_to_utf8((char *)pbVar21,&arena,arena_end);
                              std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                        (local_68,(value_type *)&nailsToNets);
                              iVar8 = iVar14;
                              break;
                            case 6:
                              if ((ulong)(local_208->super_BRDFileBase).num_nails <=
                                  (ulong)(((long)(local_208->super_BRDFileBase).nails.
                                                 super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_208->super_BRDFileBase).nails.
                                                super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
                                                ._M_impl.super__Vector_impl_data._M_start) / 0x18))
                              {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,(allocator<char> *)&nail);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x7f);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "BRDFile::BRDFile(std::vector<char> &)");
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"nails.size() < num_nails");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nail.probe = 0;
                              nail.pos.x = 0;
                              nail.pos.y = 0;
                              nail.side = Both;
                              nail.net = "UNCONNECTED";
                              lVar11 = strtol((char *)pbVar21,&p,10);
                              if ((int)(uint)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x81);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nail.probe = (uint)lVar11;
                              lVar11 = strtol(p,&p,10);
                              nail.pos.x = (int)lVar11;
                              lVar11 = strtol(p,&p,10);
                              nail.pos.y = (int)lVar11;
                              lVar11 = strtol(p,&p,10);
                              if ((int)lVar11 < 0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_e8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                           ,&local_211);
                                std::operator+(&local_1f8,&local_e8,":");
                                std::__cxx11::to_string(&local_1d8,0x84);
                                std::operator+(&local_1b8,&local_1f8,&local_1d8);
                                std::operator+(&local_178,&local_1b8,": ");
                                std::operator+(&local_198,&local_178,
                                               "auto BRDFile::BRDFile(std::vector<char> &)::(anonymous class)::operator()() const"
                                              );
                                std::operator+(&local_158,&local_198,": Assertion `");
                                std::operator+(&local_138,&local_158,"value >= 0");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&nailsToNets,&local_138,"\' failed.");
                                std::__cxx11::string::operator=(local_210,(string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&nailsToNets);
                                std::__cxx11::string::~string((string *)&local_138);
                                std::__cxx11::string::~string((string *)&local_158);
                                std::__cxx11::string::~string((string *)&local_198);
                                std::__cxx11::string::~string((string *)&local_178);
                                std::__cxx11::string::~string((string *)&local_1b8);
                                std::__cxx11::string::~string((string *)&local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::__cxx11::string::~string((string *)&local_e8);
                                SDL_LogError(1,"%s",*(undefined8 *)local_210);
                              }
                              nail.side = ((int)lVar11 == 1) + Bottom;
                              pbVar15 = (byte *)p;
                              pbVar21 = (byte *)p;
                              while( true ) {
                                pbVar21 = pbVar21 + 1;
                                uVar10 = (uint)*pbVar15;
                                if ((*pbVar15 == 0) || (iVar8 = isspace(uVar10), iVar8 == 0)) break;
                                pbVar15 = pbVar15 + 1;
                              }
                              while (((char)uVar10 != '\0' && (iVar8 = isspace(uVar10), iVar8 == 0))
                                    ) {
                                uVar10 = (uint)*pbVar21;
                                pbVar21 = pbVar21 + 1;
                              }
                              pbVar21[-1] = 0;
                              p = (char *)pbVar21;
                              nail.net = fix_to_utf8((char *)pbVar15,&arena,arena_end);
                              std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                        (local_60,(value_type *)&nail);
                              iVar8 = iVar14;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar14 = iVar8;
      }
      nailsToNets._M_h._M_buckets = &nailsToNets._M_h._M_single_bucket;
      nailsToNets._M_h._M_bucket_count = 1;
      nailsToNets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      nailsToNets._M_h._M_element_count = 0;
      nailsToNets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      nailsToNets._M_h._M_rehash_policy._M_next_resize = 0;
      nailsToNets._M_h._M_single_bucket._0_4_ = 0;
      nailsToNets._M_h._M_single_bucket._4_4_ = 0;
      pBVar2 = (local_208->super_BRDFileBase).nails.
               super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      for (pBVar19 = (local_208->super_BRDFileBase).nails.
                     super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                     super__Vector_impl_data._M_start; pBVar19 != pBVar2; pBVar19 = pBVar19 + 1) {
        pcVar3 = pBVar19->net;
        local_138._M_dataplus._M_p._0_4_ = pBVar19->probe;
        ppcVar12 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&nailsToNets,(key_type *)&local_138);
        *ppcVar12 = pcVar3;
      }
      pBVar4 = (local_208->super_BRDFileBase).pins.
               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (pBVar20 = (local_208->super_BRDFileBase).pins.
                     super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                     super__Vector_impl_data._M_start; pBVar20 != pBVar4; pBVar20 = pBVar20 + 1) {
        if (*pBVar20->net == '\0') {
          ppcVar12 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&nailsToNets,&pBVar20->probe);
          pBVar20->net = *ppcVar12;
        }
        BVar1 = (local_70->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>)._M_impl.
                super__Vector_impl_data._M_start[pBVar20->part - 1].mounting_side;
        if (BVar1 < (Top|Bottom)) {
          pBVar20->side = BVar1;
        }
      }
      (local_208->super_BRDFileBase).valid = iVar14 != 0;
      std::
      _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&nailsToNets._M_h);
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
    }
  }
  return;
}

Assistant:

BRDFile::BRDFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	// decode the file if it appears to be encoded:
	static const uint8_t encoded_header[] = {0x23, 0xe2, 0x63, 0x28};
	if (!memcmp(file_buf, encoded_header, 4)) {
		for (size_t i = 0; i < buffer_size; i++) {
			char x = file_buf[i];
			if (!(x == '\r' || x == '\n' || !x)) {
				int c = x;
				x     = ~(((c >> 6) & 3) | (c << 2));
			}
			file_buf[i] = x;
		}
	}

	int current_block = 0;
	std::vector<char*> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;
		if (!strcmp(line, "str_length:")) {
			current_block = 1;
			continue;
		}
		if (!strcmp(line, "var_data:")) {
			current_block = 2;
			continue;
		}
		if (!strcmp(line, "Format:") || !strcmp(line, "format:")) {
			current_block = 3;
			continue;
		}
		if (!strcmp(line, "Parts:") || !strcmp(line, "Pins1:")) {
			current_block = 4;
			continue;
		}
		if (!strcmp(line, "Pins:") || !strcmp(line, "Pins2:")) {
			current_block = 5;
			continue;
		}
		if (!strcmp(line, "Nails:")) {
			current_block = 6;
			continue;
		}

		char *p = line;
		char *s;
		unsigned int tmp = 0;

		switch (current_block) {
			case 2: { // var_data
				num_format = READ_UINT();
				num_parts  = READ_UINT();
				num_pins   = READ_UINT();
				num_nails  = READ_UINT();
			} break;
			case 3: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint fmt;
				fmt.x = strtol(p, &p, 10);
				fmt.y = strtol(p, &p, 10);
				format.push_back(fmt);
			} break;
			case 4: { // Parts
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;
				part.name      = READ_STR();
				tmp            = READ_UINT(); // Type and layer, actually.
				part.part_type = (tmp & 0xc) ? BRDPartType::SMD : BRDPartType::ThroughHole;
				if (tmp == 1 || (4 <= tmp && tmp < 8)) part.mounting_side = BRDPartMountingSide::Top;
				if (tmp == 2 || (8 <= tmp)) part.mounting_side            = BRDPartMountingSide::Bottom;
				part.end_of_pins                                          = READ_UINT();
				ENSURE(part.end_of_pins <= num_pins, error_msg);
				parts.push_back(part);
			} break;
			case 5: { // Pins
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;
				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				pin.probe = READ_INT(); // Can be negative (-99)
				pin.part  = READ_UINT();
				ENSURE(pin.part <= num_parts, error_msg);
				pin.net = READ_STR();
				pins.push_back(pin);
			} break;
			case 6: { // Nails
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;
				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				nail.side  = READ_UINT() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				nail.net   = READ_STR();
				nails.push_back(nail);
			} break;
		}
	}

	// Lenovo brd variant, find net from nail
	std::unordered_map<int, const char *> nailsToNets; // Map between net id and net name
	for (auto &nail : nails) {
		nailsToNets[nail.probe] = nail.net;
	}

	for (auto &pin : pins) {
		if (!strcmp(pin.net, "")) {
			try {
				pin.net = nailsToNets.at(pin.probe);
			} catch (const std::out_of_range &e) {
				pin.net = "";
			}
		}
		switch (parts[pin.part - 1].mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
	}

	valid = current_block != 0;
}